

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1cmap.c
# Opt level: O0

FT_Error t1_cmap_custom_init(T1_CMapCustom cmap,FT_Pointer pointer)

{
  FT_Face pFVar1;
  T1_Encoding encoding;
  T1_Face face;
  FT_Pointer pointer_local;
  T1_CMapCustom cmap_local;
  
  pFVar1 = (cmap->cmap).charmap.face;
  cmap->first = *(FT_UInt *)&pFVar1[2].field_0x3c;
  cmap->count = *(int *)&pFVar1[2].available_sizes - cmap->first;
  cmap->indices = *(FT_UShort **)&pFVar1[2].num_charmaps;
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  t1_cmap_custom_init( T1_CMapCustom  cmap,
                       FT_Pointer     pointer )
  {
    T1_Face      face     = (T1_Face)FT_CMAP_FACE( cmap );
    T1_Encoding  encoding = &face->type1.encoding;

    FT_UNUSED( pointer );


    cmap->first   = (FT_UInt)encoding->code_first;
    cmap->count   = (FT_UInt)encoding->code_last - cmap->first;
    cmap->indices = encoding->char_index;

    FT_ASSERT( cmap->indices );
    FT_ASSERT( encoding->code_first <= encoding->code_last );

    return 0;
  }